

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O1

void nn_bipc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_usock *self_00;
  nn_ctx **self_01;
  int iVar1;
  uint uVar2;
  ulong extraout_RAX;
  nn_list_item *pnVar3;
  nn_list_item *pnVar4;
  char *__s;
  size_t sVar5;
  nn_aipc *pnVar6;
  uint *puVar7;
  int extraout_EDX;
  uint extraout_EDX_00;
  int extraout_EDX_01;
  uint extraout_EDX_02;
  nn_fsm *pnVar8;
  nn_bipc *self_02;
  nn_fsm *pnVar9;
  sockaddr sStack_e8;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  nn_fsm *pnStack_60;
  nn_fsm *pnStack_58;
  nn_aipc *pnStack_50;
  code *pcStack_48;
  nn_fsm *pnStack_40;
  
  puVar7 = &switchD_0012a9f1::switchdataD_00134fa4;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src == -2) {
      if (type == -2) goto LAB_0012aa1a;
      nn_bipc_handler_cold_11();
      type = extraout_EDX;
      goto switchD_0012a9f1_caseD_9;
    }
LAB_0012ab47:
    nn_bipc_handler_cold_10();
    break;
  case 2:
    pnVar8 = self[8].owner;
    if (pnVar8 == (nn_fsm *)srcptr) {
      if (type == 0x85b7) {
        pnVar3 = nn_list_end((nn_list *)&self[8].ctx);
        nn_list_insert((nn_list *)&self[8].ctx,(nn_list_item *)&pnVar8[0x14].stopped.item,pnVar3);
        self[8].owner = (nn_fsm *)0x0;
        nn_bipc_start_accepting((nn_bipc *)self);
        return;
      }
      goto LAB_0012ab6a;
    }
    if (src != 2) {
      nn_bipc_handler_cold_7();
      goto LAB_0012ab2c;
    }
    if (type == 0x85b9) {
      nn_list_erase((nn_list *)&self[8].ctx,(nn_list_item *)((long)srcptr + 0x730));
      nn_aipc_term((nn_aipc *)srcptr);
      nn_free(srcptr);
      return;
    }
    uVar2 = 2;
    if (type == 0x85b8) {
      nn_aipc_stop((nn_aipc *)srcptr);
      return;
    }
    goto LAB_0012ab73;
  default:
    goto switchD_0012a9f1_caseD_3;
  case 7:
    if (src != 3) goto LAB_0012ab35;
    if (type == 1) {
      nn_backoff_stop((nn_backoff *)&self[8].stopped.src);
      *(undefined4 *)&self[1].fn = 9;
      return;
    }
    goto LAB_0012ab57;
  case 8:
    if (src != 1) goto LAB_0012ab3e;
    if (type == 8) {
      return;
    }
    if (type == 7) {
      nn_backoff_start((nn_backoff *)&self[8].stopped.src);
      *(undefined4 *)&self[1].fn = 7;
      return;
    }
    goto LAB_0012ab63;
  case 9:
switchD_0012a9f1_caseD_9:
    if (src != 3) {
LAB_0012ab2c:
      nn_bipc_handler_cold_1();
LAB_0012ab35:
      nn_bipc_handler_cold_3();
LAB_0012ab3e:
      nn_bipc_handler_cold_5();
      goto LAB_0012ab47;
    }
    if (type == 2) {
LAB_0012aa1a:
      nn_bipc_start_listening((nn_bipc *)self);
      return;
    }
  }
  nn_bipc_handler_cold_2();
LAB_0012ab57:
  nn_bipc_handler_cold_4();
switchD_0012a9f1_caseD_3:
  nn_bipc_handler_cold_12();
LAB_0012ab63:
  nn_bipc_handler_cold_6();
  type = extraout_EDX_00;
LAB_0012ab6a:
  uVar2 = type;
  nn_bipc_handler_cold_9();
  type = extraout_EDX_01;
LAB_0012ab73:
  pnVar8 = (nn_fsm *)(ulong)uVar2;
  nn_bipc_handler_cold_8();
  pnStack_40 = self;
  if (extraout_EDX_02 == 0xfffffffd && type == -2) goto LAB_0012abc2;
  while( true ) {
    pnVar9 = pnVar8 + 1;
    if (*(int *)&pnVar8[1].fn == 3) {
      pcStack_48 = (code *)0x12abd7;
      nn_bipc_shutdown_cold_2();
      if ((extraout_RAX & 1) != 0) {
        return;
      }
    }
    uVar2 = *(uint *)&pnVar9->fn;
    self_02 = (nn_bipc *)(ulong)uVar2;
    if (uVar2 == 4) {
      pcStack_48 = (code *)0x12abe9;
      iVar1 = nn_usock_isidle((nn_usock *)&pnVar8[1].srcptr);
      if (iVar1 == 0) {
        return;
      }
      pcStack_48 = (code *)0x12abfd;
      iVar1 = nn_backoff_isidle((nn_backoff *)&pnVar8[8].stopped.src);
      if (iVar1 == 0) {
        return;
      }
      self_01 = &pnVar8[8].ctx;
      pcStack_48 = (code *)0x12ac14;
      pnVar3 = nn_list_begin((nn_list *)self_01);
      while( true ) {
        pcStack_48 = (code *)0x12ac1f;
        pnVar4 = nn_list_end((nn_list *)self_01);
        if (pnVar3 == pnVar4) break;
        pnVar6 = (nn_aipc *)(pnVar3 + -0x73);
        if (pnVar3 == (nn_list_item *)0x0) {
          pnVar6 = (nn_aipc *)0x0;
        }
        pcStack_48 = (code *)0x12ac38;
        nn_aipc_stop(pnVar6);
        pcStack_48 = (code *)0x12ac43;
        pnVar3 = nn_list_next((nn_list *)self_01,pnVar3);
      }
      *(undefined4 *)&pnVar9->fn = 5;
      goto LAB_0012ac7f;
    }
    if (uVar2 == 5) break;
    pcStack_48 = (code *)0x12abc2;
    nn_bipc_shutdown_cold_4();
LAB_0012abc2:
    pcStack_48 = (code *)0x12abca;
    nn_bipc_shutdown_cold_1();
  }
  if ((type == 2) && (extraout_EDX_02 == 0x85b9)) {
    pcStack_48 = (code *)0x12ac66;
    nn_list_erase((nn_list *)&pnVar8[8].ctx,&((nn_aipc *)puVar7)->item);
    pcStack_48 = (code *)0x12ac6e;
    nn_aipc_term((nn_aipc *)puVar7);
    pcStack_48 = (code *)0x12ac76;
    nn_free(puVar7);
LAB_0012ac7f:
    pcStack_48 = (code *)0x12ac8b;
    iVar1 = nn_list_empty((nn_list *)&pnVar8[8].ctx);
    if (iVar1 == 0) {
      return;
    }
    *(undefined4 *)&pnVar8[1].fn = 1;
    pcStack_48 = (code *)0x12ac9e;
    nn_fsm_stopped_noevent(pnVar8);
    nn_epbase_stopped((nn_epbase *)&pnVar8[1].shutdown_fn);
    return;
  }
  pcStack_48 = nn_bipc_start_listening;
  nn_bipc_shutdown_cold_3();
  pnStack_60 = pnVar8;
  pnStack_58 = pnVar9;
  pnStack_50 = (nn_aipc *)puVar7;
  pcStack_48 = (code *)(ulong)extraout_EDX_02;
  __s = nn_epbase_getaddr(&self_02->epbase);
  sStack_e8.sa_family = 0;
  sStack_e8.sa_data[0] = '\0';
  sStack_e8.sa_data[1] = '\0';
  sStack_e8.sa_data[2] = '\0';
  sStack_e8.sa_data[3] = '\0';
  sStack_e8.sa_data[4] = '\0';
  sStack_e8.sa_data[5] = '\0';
  sStack_e8.sa_data[6] = '\0';
  sStack_e8.sa_data[7] = '\0';
  sStack_e8.sa_data[8] = '\0';
  sStack_e8.sa_data[9] = '\0';
  sStack_e8.sa_data[10] = '\0';
  sStack_e8.sa_data[0xb] = '\0';
  sStack_e8.sa_data[0xc] = '\0';
  sStack_e8.sa_data[0xd] = '\0';
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  uStack_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  uStack_a0 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  uStack_78 = 0;
  uStack_70 = 0;
  sVar5 = strlen(__s);
  if (0x6b < sVar5) {
    nn_bipc_start_listening_cold_4();
    goto LAB_0012ae2b;
  }
  sStack_e8.sa_family = 1;
  strncpy(sStack_e8.sa_data,__s,0x6c);
  uVar2 = socket(1,1,0);
  if ((int)uVar2 < 0) {
LAB_0012adb7:
    self_00 = &self_02->usock;
    iVar1 = nn_usock_start(self_00,1,1,0);
    if (-1 < iVar1) {
      iVar1 = nn_usock_bind(self_00,&sStack_e8,0x6e);
      if ((-1 < iVar1) && (iVar1 = nn_usock_listen(self_00,10), -1 < iVar1)) {
        nn_bipc_start_accepting(self_02);
        self_02->state = 2;
        return;
      }
      nn_usock_stop(self_00);
      self_02->state = 8;
      return;
    }
LAB_0012ae2b:
    nn_backoff_start(&self_02->retry);
    self_02->state = 7;
    return;
  }
  iVar1 = fcntl(uVar2,4,0x800);
  if (iVar1 == -1) {
    puVar7 = (uint *)__errno_location();
    pnVar8 = (nn_fsm *)(ulong)*puVar7;
    if (*puVar7 == 0x16) goto LAB_0012ad6f;
  }
  else {
LAB_0012ad6f:
    iVar1 = connect(uVar2,(sockaddr *)&sStack_e8,0x6e);
    if ((((iVar1 == -1) && (puVar7 = (uint *)__errno_location(), *puVar7 == 0x6f)) &&
        (iVar1 = unlink(__s), iVar1 != 0)) && (pnVar8 = (nn_fsm *)(ulong)*puVar7, *puVar7 != 2))
    goto LAB_0012ae4d;
    pnVar8 = (nn_fsm *)(ulong)uVar2;
    iVar1 = close(uVar2);
    if (iVar1 == 0) goto LAB_0012adb7;
    nn_bipc_start_listening_cold_3();
  }
  nn_bipc_start_listening_cold_1();
LAB_0012ae4d:
  nn_bipc_start_listening_cold_2();
  if (pnVar8[8].owner == (nn_fsm *)0x0) {
    pnVar9 = (nn_fsm *)0x740;
    pnVar6 = (nn_aipc *)nn_alloc_(0x740);
    pnVar8[8].owner = (nn_fsm *)pnVar6;
    if (pnVar6 != (nn_aipc *)0x0) {
      nn_aipc_init(pnVar6,2,(nn_epbase *)&pnVar8[1].shutdown_fn,pnVar8);
      nn_aipc_start((nn_aipc *)pnVar8[8].owner,(nn_usock *)&pnVar8[1].srcptr);
      return;
    }
  }
  else {
    nn_bipc_start_accepting_cold_1();
    pnVar9 = pnVar8;
  }
  nn_bipc_start_accepting_cold_2();
  if (pnVar9 != (nn_fsm *)0x0) {
    pnVar9 = (nn_fsm *)&pnVar9[-2].stopped.item;
  }
  nn_fsm_stop(pnVar9);
  return;
}

Assistant:

static void nn_bipc_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_bipc *bipc;
    struct nn_aipc *aipc;

    bipc = nn_cont (self, struct nn_bipc, fsm);

    switch (bipc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BIPC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_bipc_start_listening (bipc);
                return;
            default:
                nn_fsm_bad_action (bipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (bipc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  The execution is yielded to the aipc state machine in this state.         */
/******************************************************************************/
    case NN_BIPC_STATE_ACTIVE:
        if (srcptr == bipc->aipc) {
            switch (type) {
            case NN_AIPC_ACCEPTED:

                /*  Move the newly created connection to the list of existing
                    connections. */
                nn_list_insert (&bipc->aipcs, &bipc->aipc->item,
                    nn_list_end (&bipc->aipcs));
                bipc->aipc = NULL;

                /*  Start waiting for a new incoming connection. */
                nn_bipc_start_accepting (bipc);

                return;

            default:
                nn_fsm_bad_action (bipc->state, src, type);
            }
        }

        /*  For all remaining events we'll assume they are coming from one
            of remaining child aipc objects. */
        nn_assert (src == NN_BIPC_SRC_AIPC);
        aipc = (struct nn_aipc*) srcptr;
        switch (type) {
        case NN_AIPC_ERROR:
            nn_aipc_stop (aipc);
            return;
        case NN_AIPC_STOPPED:
            nn_list_erase (&bipc->aipcs, &aipc->item);
            nn_aipc_term (aipc);
            nn_free (aipc);
            return;
        default:
            nn_fsm_bad_action (bipc->state, src, type);
        }

/******************************************************************************/
/*  CLOSING_USOCK state.                                                     */
/*  usock object was asked to stop but it haven't stopped yet.                */
/******************************************************************************/
    case NN_BIPC_STATE_CLOSING:
        switch (src) {

        case NN_BIPC_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                nn_backoff_start (&bipc->retry);
                bipc->state = NN_BIPC_STATE_WAITING;
                return;
            default:
                nn_fsm_bad_action (bipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (bipc->state, src, type);
        }

/******************************************************************************/
/*  WAITING state.                                                            */
/*  Waiting before re-bind is attempted. This way we won't overload           */
/*  the system by continuous re-bind attemps.                                 */
/******************************************************************************/
    case NN_BIPC_STATE_WAITING:
        switch (src) {

        case NN_BIPC_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_TIMEOUT:
                nn_backoff_stop (&bipc->retry);
                bipc->state = NN_BIPC_STATE_STOPPING_BACKOFF;
                return;
            default:
                nn_fsm_bad_action (bipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (bipc->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_BACKOFF state.                                                   */
/*  backoff object was asked to stop, but it haven't stopped yet.             */
/******************************************************************************/
    case NN_BIPC_STATE_STOPPING_BACKOFF:
        switch (src) {

        case NN_BIPC_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_STOPPED:
                nn_bipc_start_listening (bipc);
                return;
            default:
                nn_fsm_bad_action (bipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (bipc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (bipc->state, src, type);
    }
}